

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_slow.c
# Opt level: O0

block_state deflate_slow(deflate_state *s,int flush)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  zng_stream *strm;
  int in_ESI;
  deflate_state *in_RDI;
  uint insert_cnt;
  uint mov_fwd;
  uint max_insert;
  match_func longest_match;
  uint32_t match_len;
  int64_t dist;
  int bflush;
  Pos hash_head;
  deflate_state *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar4;
  uint32_t local_44;
  _func_uint32_t_deflate_state_ptr_Pos *local_38;
  uint local_2c;
  ushort local_16;
  
  if (in_RDI->max_chain_length < 0x401) {
    local_38 = functable.longest_match;
  }
  else {
    local_38 = functable.longest_match_slow;
  }
  do {
    if (in_RDI->lookahead < 0x106) {
      zng_fill_window(in_stack_ffffffffffffff80);
      if (in_RDI->lookahead < 0x106 && in_ESI == 0) {
        return need_more;
      }
      if (in_RDI->lookahead == 0) {
        if (in_RDI->match_available != 0) {
          zng_tr_tally_lit(in_RDI,in_RDI->window[in_RDI->strstart - 1]);
          in_RDI->match_available = 0;
        }
        if (in_RDI->strstart < 2) {
          uVar4 = in_RDI->strstart;
        }
        else {
          uVar4 = 2;
        }
        in_RDI->insert = uVar4;
        if (in_ESI == 4) {
          if (in_RDI->block_start < 0) {
            strm = (zng_stream *)0x0;
          }
          else {
            strm = (zng_stream *)(in_RDI->window + (uint)in_RDI->block_start);
          }
          zng_tr_flush_block((deflate_state *)CONCAT44(uVar4,in_stack_ffffffffffffff90),
                             (char *)in_RDI,(uint32_t)((ulong)strm >> 0x20),(int)strm);
          in_RDI->block_start = in_RDI->strstart;
          zng_flush_pending(strm);
          if (in_RDI->strm->avail_out == 0) {
            return finish_started;
          }
          return finish_done;
        }
        if (in_RDI->sym_next != 0) {
          zng_tr_flush_block((deflate_state *)CONCAT44(uVar4,in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff88,
                             (uint32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                             (int)in_stack_ffffffffffffff80);
          in_RDI->block_start = in_RDI->strstart;
          zng_flush_pending((zng_stream *)in_stack_ffffffffffffff80);
          if (in_RDI->strm->avail_out == 0) {
            return need_more;
          }
        }
        return block_done;
      }
    }
    local_16 = 0;
    if (3 < in_RDI->lookahead) {
      local_16 = (*in_RDI->quick_insert_string)(in_RDI,in_RDI->strstart);
    }
    in_RDI->prev_match = (Pos)in_RDI->match_start;
    local_2c = 2;
    lVar3 = (ulong)in_RDI->strstart - (ulong)local_16;
    if (((((lVar3 <= (long)(ulong)(in_RDI->w_size - 0x106)) && (0 < lVar3)) &&
         (in_RDI->prev_length < in_RDI->max_lazy_match)) &&
        ((local_16 != 0 && (local_2c = (*local_38)(in_RDI,local_16), local_2c < 6)))) &&
       (in_RDI->strategy == 1)) {
      local_2c = 2;
    }
    if ((in_RDI->prev_length < 3) || (in_RDI->prev_length < local_2c)) {
      if (in_RDI->match_available == 0) {
        in_RDI->prev_length = local_2c;
        in_RDI->match_available = 1;
        in_RDI->strstart = in_RDI->strstart + 1;
        in_RDI->lookahead = in_RDI->lookahead - 1;
      }
      else {
        iVar2 = zng_tr_tally_lit(in_RDI,in_RDI->window[in_RDI->strstart - 1]);
        if (iVar2 != 0) {
          zng_tr_flush_block((deflate_state *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff88,
                             (uint32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                             (int)in_stack_ffffffffffffff80);
          in_RDI->block_start = in_RDI->strstart;
          zng_flush_pending((zng_stream *)in_stack_ffffffffffffff80);
        }
        in_RDI->prev_length = local_2c;
        in_RDI->strstart = in_RDI->strstart + 1;
        in_RDI->lookahead = in_RDI->lookahead - 1;
        if (in_RDI->strm->avail_out == 0) {
          return need_more;
        }
      }
    }
    else {
      uVar1 = (in_RDI->strstart + in_RDI->lookahead) - 3;
      iVar2 = zng_tr_tally_dist(in_RDI,(in_RDI->strstart - 1) - (uint)in_RDI->prev_match,
                                in_RDI->prev_length - 3);
      in_RDI->prev_length = in_RDI->prev_length - 1;
      in_RDI->lookahead = in_RDI->lookahead - in_RDI->prev_length;
      uVar4 = in_RDI->prev_length;
      local_44 = uVar4 - 1;
      if (in_RDI->strstart < uVar1) {
        if (uVar1 - in_RDI->strstart < local_44) {
          local_44 = uVar1 - in_RDI->strstart;
        }
        (*in_RDI->insert_string)(in_RDI,in_RDI->strstart + 1,local_44);
      }
      in_RDI->prev_length = 0;
      in_RDI->match_available = 0;
      in_RDI->strstart = uVar4 + in_RDI->strstart;
      if (iVar2 != 0) {
        zng_tr_flush_block((deflate_state *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88,
                           (uint32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                           (int)in_stack_ffffffffffffff80);
        in_RDI->block_start = in_RDI->strstart;
        zng_flush_pending((zng_stream *)in_stack_ffffffffffffff80);
        if (in_RDI->strm->avail_out == 0) {
          return need_more;
        }
      }
    }
  } while( true );
}

Assistant:

Z_INTERNAL block_state deflate_slow(deflate_state *s, int flush) {
    Pos hash_head;           /* head of hash chain */
    int bflush;              /* set if current block must be flushed */
    int64_t dist;
    uint32_t match_len;
    match_func longest_match;

    if (s->max_chain_length <= 1024)
        longest_match = FUNCTABLE_FPTR(longest_match);
    else
        longest_match = FUNCTABLE_FPTR(longest_match_slow);

    /* Process the input block. */
    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need STD_MAX_MATCH bytes
         * for the next match, plus WANT_MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            PREFIX(fill_window)(s);
            if (UNLIKELY(s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH)) {
                return need_more;
            }
            if (UNLIKELY(s->lookahead == 0))
                break; /* flush the current block */
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
        hash_head = 0;
        if (LIKELY(s->lookahead >= WANT_MIN_MATCH)) {
            hash_head = s->quick_insert_string(s, s->strstart);
        }

        /* Find the longest match, discarding those <= prev_length.
         */
        s->prev_match = (Pos)s->match_start;
        match_len = STD_MIN_MATCH - 1;
        dist = (int64_t)s->strstart - hash_head;

        if (dist <= MAX_DIST(s) && dist > 0 && s->prev_length < s->max_lazy_match && hash_head != 0) {
            /* To simplify the code, we prevent matches with the string
             * of window index 0 (in particular we have to avoid a match
             * of the string with itself at the start of the input file).
             */
            match_len = longest_match(s, hash_head);
            /* longest_match() sets match_start */

            if (match_len <= 5 && (s->strategy == Z_FILTERED)) {
                /* If prev_match is also WANT_MIN_MATCH, match_start is garbage
                 * but we will ignore the current match anyway.
                 */
                match_len = STD_MIN_MATCH - 1;
            }
        }
        /* If there was a match at the previous step and the current
         * match is not better, output the previous match:
         */
        if (s->prev_length >= STD_MIN_MATCH && match_len <= s->prev_length) {
            unsigned int max_insert = s->strstart + s->lookahead - STD_MIN_MATCH;
            /* Do not insert strings in hash table beyond this. */

            Assert((s->strstart-1) <= UINT16_MAX, "strstart-1 should fit in uint16_t");
            check_match(s, (Pos)(s->strstart - 1), s->prev_match, s->prev_length);

            bflush = zng_tr_tally_dist(s, s->strstart -1 - s->prev_match, s->prev_length - STD_MIN_MATCH);

            /* Insert in hash table all strings up to the end of the match.
             * strstart-1 and strstart are already inserted. If there is not
             * enough lookahead, the last two strings are not inserted in
             * the hash table.
             */
            s->prev_length -= 1;
            s->lookahead -= s->prev_length;

            unsigned int mov_fwd = s->prev_length - 1;
            if (max_insert > s->strstart) {
                unsigned int insert_cnt = mov_fwd;
                if (UNLIKELY(insert_cnt > max_insert - s->strstart))
                    insert_cnt = max_insert - s->strstart;
                s->insert_string(s, s->strstart + 1, insert_cnt);
            }
            s->prev_length = 0;
            s->match_available = 0;
            s->strstart += mov_fwd + 1;

            if (UNLIKELY(bflush))
                FLUSH_BLOCK(s, 0);

        } else if (s->match_available) {
            /* If there was no match at the previous position, output a
             * single literal. If there was a match but the current match
             * is longer, truncate the previous match to a single literal.
             */
            bflush = zng_tr_tally_lit(s, s->window[s->strstart-1]);
            if (UNLIKELY(bflush))
                FLUSH_BLOCK_ONLY(s, 0);
            s->prev_length = match_len;
            s->strstart++;
            s->lookahead--;
            if (UNLIKELY(s->strm->avail_out == 0))
                return need_more;
        } else {
            /* There is no previous match to compare with, wait for
             * the next step to decide.
             */
            s->prev_length = match_len;
            s->match_available = 1;
            s->strstart++;
            s->lookahead--;
        }
    }
    Assert(flush != Z_NO_FLUSH, "no flush?");
    if (UNLIKELY(s->match_available)) {
        Z_UNUSED(zng_tr_tally_lit(s, s->window[s->strstart-1]));
        s->match_available = 0;
    }
    s->insert = s->strstart < (STD_MIN_MATCH - 1) ? s->strstart : (STD_MIN_MATCH - 1);
    if (UNLIKELY(flush == Z_FINISH)) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (UNLIKELY(s->sym_next))
        FLUSH_BLOCK(s, 0);
    return block_done;
}